

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

double __thiscall booster::log::sinks::syslog::log(syslog *this,double __x)

{
  uint uVar1;
  char *pcVar2;
  message *this_00;
  char *pcVar3;
  message *in_RSI;
  double dVar4;
  level_type l;
  int syslevel;
  undefined4 in_stack_ffffffffffffff98;
  int __pri;
  string local_38 [32];
  level_type local_18;
  int local_14;
  message *local_10;
  syslog *local_8;
  
  local_10 = in_RSI;
  local_8 = this;
  local_18 = message::level(in_RSI);
  if ((int)local_18 < 10) {
    local_14 = 0;
  }
  else if (((int)local_18 < 10) || (0x13 < (int)local_18)) {
    if (((int)local_18 < 0x14) || (0x1d < (int)local_18)) {
      if (((int)local_18 < 0x1e) || (0x27 < (int)local_18)) {
        if (((int)local_18 < 0x28) || (0x31 < (int)local_18)) {
          if (((int)local_18 < 0x32) || (0x3b < (int)local_18)) {
            if (((int)local_18 < 0x3c) || (0x45 < (int)local_18)) {
              local_14 = 7;
            }
            else {
              local_14 = 6;
            }
          }
          else {
            local_14 = 5;
          }
        }
        else {
          local_14 = 4;
        }
      }
      else {
        local_14 = 3;
      }
    }
    else {
      local_14 = 2;
    }
  }
  else {
    local_14 = 1;
  }
  __pri = local_14;
  pcVar2 = message::module(local_10);
  message::log_message_abi_cxx11_((message *)CONCAT44(__pri,in_stack_ffffffffffffff98));
  this_00 = (message *)std::__cxx11::string::c_str();
  pcVar3 = message::file_name(this_00);
  uVar1 = message::file_line(local_10);
  ::syslog(__pri,"%s: %s (%s:%d)",pcVar2,this_00,pcVar3,(ulong)uVar1);
  dVar4 = (double)std::__cxx11::string::~string(local_38);
  return dVar4;
}

Assistant:

void syslog::log(message const &msg)
		{
			int syslevel;
			level_type l=msg.level();
			if(/*emergency <= l &&*/ l < alert)
				syslevel = LOG_EMERG;
			else if(alert <= l && l < critical)
				syslevel = LOG_ALERT;
			else if(critical <= l && l < error)
				syslevel = LOG_CRIT;
			else if(error <= l && l < warning)
				syslevel=LOG_ERR;
			else if(warning <= l && l < notice)
				syslevel = LOG_WARNING;
			else if(notice <= l && l< info)
				syslevel = LOG_NOTICE;
			else if(info <= l && l<debug)
				syslevel = LOG_INFO;
			else /*if(debug <= l)*/
				syslevel = LOG_DEBUG;
			::syslog(syslevel,"%s: %s (%s:%d)",msg.module(),msg.log_message().c_str(),msg.file_name(),msg.file_line());
		}